

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O2

void __thiscall duckdb::ExtensionFunctionInfo::~ExtensionFunctionInfo(ExtensionFunctionInfo *this)

{
  ~ExtensionFunctionInfo(this);
  operator_delete(this);
  return;
}

Assistant:

explicit ExtensionFunctionInfo(string extension_p) : extension(std::move(extension_p)) {
	}